

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

bool __thiscall
AddrManImpl::AddSingle(AddrManImpl *this,CAddress *addr,CNetAddr *source,seconds time_penalty)

{
  ServiceFlags *pSVar1;
  bool bVar2;
  int iVar3;
  uint nUBucketPos_00;
  uint32_t uVar4;
  AddrInfo *this_00;
  time_point tVar5;
  long lVar6;
  long lVar7;
  mapped_type *this_01;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> now;
  rep rVar8;
  long lVar9;
  ulong uVar10;
  CAddress *pCVar11;
  long lVar12;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  allocator<char> local_8d;
  uint32_t mapped_as;
  int nUBucketPos;
  int nUBucket;
  nid_type nId;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CNetAddr::IsRoutable((CNetAddr *)addr);
  if (!bVar2) goto LAB_006aa176;
  this_00 = Find(this,&addr->super_CService,&nId);
  bVar2 = ::operator==((CNetAddr *)addr,source);
  if (bVar2) {
    time_penalty.__r = 0;
  }
  if (this_00 == (AddrInfo *)0x0) {
    this_00 = Create(this,addr,source,&nId);
    lVar7 = (this_00->super_CAddress).nTime.__d.__r - time_penalty.__r;
    rVar8 = 0;
    if (0 < lVar7) {
      rVar8 = lVar7;
    }
    (this_00->super_CAddress).nTime.__d.__r = rVar8;
  }
  else {
    tVar5 = NodeClock::now();
    lVar7 = (addr->nTime).__d.__r;
    lVar9 = lVar7 - time_penalty.__r;
    lVar12 = lVar9 + -0x15180;
    if (lVar7 * -1000000000 + (long)tVar5.__d.__r < 86400000000000) {
      lVar12 = lVar9 + -0xe10;
    }
    lVar6 = (this_00->super_CAddress).nTime.__d.__r;
    if (lVar6 < lVar12) {
      lVar6 = 0;
      if (0 < lVar9) {
        lVar6 = lVar9;
      }
      (this_00->super_CAddress).nTime.__d.__r = lVar6;
      lVar7 = (addr->nTime).__d.__r;
    }
    pSVar1 = &(this_00->super_CAddress).nServices;
    *pSVar1 = *pSVar1 | addr->nServices;
    if ((((lVar7 <= lVar6) || (this_00->fInTried != false)) ||
        (iVar3 = this_00->nRefCount, iVar3 == 8)) ||
       ((0 < iVar3 &&
        (iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                           (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,
                            1 << ((byte)iVar3 & 0x1f)), iVar3 != 0)))) goto LAB_006aa176;
  }
  iVar3 = AddrInfo::GetNewBucket(this_00,&this->nKey,source,this->m_netgroupman);
  nUBucket = iVar3;
  nUBucketPos_00 = AddrInfo::GetBucketPosition(this_00,&this->nKey,true,iVar3);
  lVar12 = (ulong)(uint)(iVar3 << 9) + 0x20180;
  uVar10 = (ulong)nUBucketPos_00;
  lVar7 = *(long *)((long)this->vvNew[0] + uVar10 * 8 + lVar12 + -0x20180);
  bVar2 = lVar7 == -1;
  nUBucketPos = nUBucketPos_00;
  if (lVar7 == nId) goto LAB_006aa178;
  if (lVar7 != -1) {
    this_01 = std::__detail::
              _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->mapInfo,
                           (key_type *)((long)this->vvNew[0] + uVar10 * 8 + lVar12 + -0x20180));
    now = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    bVar2 = AddrInfo::IsTerrible(this_01,(NodeSeconds)now.__d.__r);
    if (!bVar2) {
      if (this_01->nRefCount < 2) {
        if (this_00->nRefCount == 0) {
          Delete(this,nId);
        }
      }
      else if (this_00->nRefCount == 0) goto LAB_006aa0c3;
LAB_006aa176:
      bVar2 = false;
      goto LAB_006aa178;
    }
  }
LAB_006aa0c3:
  ClearNew(this,iVar3,nUBucketPos_00);
  this_00->nRefCount = this_00->nRefCount + 1;
  *(nid_type *)((long)this->vvNew[0] + uVar10 * 8 + (ulong)(uint)(iVar3 << 9)) = nId;
  pCVar11 = addr;
  uVar4 = NetGroupManager::GetMappedAS(this->m_netgroupman,(CNetAddr *)addr);
  mapped_as = uVar4;
  bVar2 = ::LogAcceptCategory(ADDRMAN,(Level)pCVar11);
  if (bVar2) {
    CService::ToStringAddrPort_abi_cxx11_(&local_58,&addr->super_CService);
    if (uVar4 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_8d);
    }
    else {
      tinyformat::format<unsigned_int>(&local_78," mapped to AS%i",&mapped_as);
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
    ;
    source_file._M_len = 0x5b;
    logging_function._M_str = "AddSingle";
    logging_function._M_len = 9;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int,int>
              (logging_function,source_file,0x268,ADDRMAN,Debug,(ConstevalFormatString<4U>)0xc8bd6d,
               &local_58,&local_78,&nUBucket,&nUBucketPos);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar2 = true;
LAB_006aa178:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool AddrManImpl::AddSingle(const CAddress& addr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    AssertLockHeld(cs);

    if (!addr.IsRoutable())
        return false;

    nid_type nId;
    AddrInfo* pinfo = Find(addr, &nId);

    // Do not set a penalty for a source's self-announcement
    if (addr == source) {
        time_penalty = 0s;
    }

    if (pinfo) {
        // periodically update nTime
        const bool currently_online{NodeClock::now() - addr.nTime < 24h};
        const auto update_interval{currently_online ? 1h : 24h};
        if (pinfo->nTime < addr.nTime - update_interval - time_penalty) {
            pinfo->nTime = std::max(NodeSeconds{0s}, addr.nTime - time_penalty);
        }

        // add services
        pinfo->nServices = ServiceFlags(pinfo->nServices | addr.nServices);

        // do not update if no new information is present
        if (addr.nTime <= pinfo->nTime) {
            return false;
        }

        // do not update if the entry was already in the "tried" table
        if (pinfo->fInTried)
            return false;

        // do not update if the max reference count is reached
        if (pinfo->nRefCount == ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
            return false;

        // stochastic test: previous nRefCount == N: 2^N times harder to increase it
        if (pinfo->nRefCount > 0) {
            const int nFactor{1 << pinfo->nRefCount};
            if (insecure_rand.randrange(nFactor) != 0) return false;
        }
    } else {
        pinfo = Create(addr, source, &nId);
        pinfo->nTime = std::max(NodeSeconds{0s}, pinfo->nTime - time_penalty);
    }

    int nUBucket = pinfo->GetNewBucket(nKey, source, m_netgroupman);
    int nUBucketPos = pinfo->GetBucketPosition(nKey, true, nUBucket);
    bool fInsert = vvNew[nUBucket][nUBucketPos] == -1;
    if (vvNew[nUBucket][nUBucketPos] != nId) {
        if (!fInsert) {
            AddrInfo& infoExisting = mapInfo[vvNew[nUBucket][nUBucketPos]];
            if (infoExisting.IsTerrible() || (infoExisting.nRefCount > 1 && pinfo->nRefCount == 0)) {
                // Overwrite the existing new table entry.
                fInsert = true;
            }
        }
        if (fInsert) {
            ClearNew(nUBucket, nUBucketPos);
            pinfo->nRefCount++;
            vvNew[nUBucket][nUBucketPos] = nId;
            const auto mapped_as{m_netgroupman.GetMappedAS(addr)};
            LogDebug(BCLog::ADDRMAN, "Added %s%s to new[%i][%i]\n",
                     addr.ToStringAddrPort(), (mapped_as ? strprintf(" mapped to AS%i", mapped_as) : ""), nUBucket, nUBucketPos);
        } else {
            if (pinfo->nRefCount == 0) {
                Delete(nId);
            }
        }
    }
    return fInsert;
}